

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O2

void SUNMatDestroy_Band(SUNMatrix A)

{
  void *__ptr;
  
  if (A != (SUNMatrix)0x0) {
    __ptr = A->content;
    if (__ptr != (void *)0x0) {
      if (*(void **)((long)__ptr + 0x18) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x18));
        __ptr = A->content;
        *(undefined8 *)((long)__ptr + 0x18) = 0;
      }
      if (*(void **)((long)__ptr + 0x28) != (void *)0x0) {
        free(*(void **)((long)__ptr + 0x28));
        __ptr = A->content;
        *(undefined8 *)((long)__ptr + 0x28) = 0;
      }
      free(__ptr);
      A->content = (void *)0x0;
    }
    free(A->ops);
    free(A);
    return;
  }
  return;
}

Assistant:

void SUNMatDestroy_Band(SUNMatrix A)
{
  if (A == NULL) return;

  /* free content */
  if (A->content != NULL) {
    /* free data array */
    if (SM_DATA_B(A)) {
      free(SM_DATA_B(A));
      SM_DATA_B(A) = NULL;
    }
    /* free column pointers */
    if (SM_COLS_B(A)) {
      free(SM_COLS_B(A));
      SM_COLS_B(A) = NULL;
    }
    /* free content struct */
    free(A->content);
    A->content = NULL;
  }

  /* free ops and matrix */
  if (A->ops) { free(A->ops); A->ops = NULL; }
  free(A); A = NULL;

  return;
}